

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glwInitFunctions.cpp
# Opt level: O0

void glw::initGL31Core(Functions *gl,FunctionLoader *loader)

{
  undefined8 uVar1;
  FunctionLoader *loader_local;
  Functions *gl_local;
  
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glActiveTexture");
  *(undefined8 *)(gl + 8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glAttachShader");
  *(undefined8 *)(gl + 0x10) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBeginConditionalRender");
  *(undefined8 *)(gl + 0x18) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBeginQuery");
  *(undefined8 *)(gl + 0x20) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBeginTransformFeedback");
  *(undefined8 *)(gl + 0x30) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindAttribLocation");
  *(undefined8 *)(gl + 0x38) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindBuffer");
  *(undefined8 *)(gl + 0x40) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindBufferBase");
  *(undefined8 *)(gl + 0x48) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindBufferRange");
  *(undefined8 *)(gl + 0x50) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindFragDataLocation");
  *(undefined8 *)(gl + 0x68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindFramebuffer");
  *(undefined8 *)(gl + 0x78) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindRenderbuffer");
  *(undefined8 *)(gl + 0xa0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindTexture");
  *(undefined8 *)(gl + 0xb8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBindVertexArray");
  *(undefined8 *)(gl + 0xd8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendColor");
  *(undefined8 *)(gl + 0xf8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendEquation");
  *(undefined8 *)(gl + 0x100) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendEquationSeparate");
  *(undefined8 *)(gl + 0x108) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendFunc");
  *(undefined8 *)(gl + 0x120) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlendFuncSeparate");
  *(undefined8 *)(gl + 0x128) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBlitFramebuffer");
  *(undefined8 *)(gl + 0x140) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBufferData");
  *(undefined8 *)(gl + 0x150) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glBufferSubData");
  *(undefined8 *)(gl + 0x168) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCheckFramebufferStatus");
  *(undefined8 *)(gl + 0x170) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClampColor");
  *(undefined8 *)(gl + 0x180) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClear");
  *(undefined8 *)(gl + 0x188) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferfi");
  *(undefined8 *)(gl + 0x1a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferfv");
  *(undefined8 *)(gl + 0x1a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferiv");
  *(undefined8 *)(gl + 0x1b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearBufferuiv");
  *(undefined8 *)(gl + 0x1b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearColor");
  *(undefined8 *)(gl + 0x1c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearDepth");
  *(undefined8 *)(gl + 0x1c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glClearStencil");
  *(undefined8 *)(gl + 0x208) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glColorMask");
  *(undefined8 *)(gl + 0x238) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glColorMaski");
  *(undefined8 *)(gl + 0x240) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompileShader");
  *(undefined8 *)(gl + 0x248) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexImage1D");
  *(undefined8 *)(gl + 0x280) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexImage2D");
  *(undefined8 *)(gl + 0x288) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexImage3D");
  *(undefined8 *)(gl + 0x290) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexSubImage1D");
  *(undefined8 *)(gl + 0x2a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexSubImage2D");
  *(undefined8 *)(gl + 0x2a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCompressedTexSubImage3D");
  *(undefined8 *)(gl + 0x2b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyBufferSubData");
  *(undefined8 *)(gl + 0x308) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexImage1D");
  *(undefined8 *)(gl + 0x348) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexImage2D");
  *(undefined8 *)(gl + 0x350) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexSubImage1D");
  *(undefined8 *)(gl + 0x358) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexSubImage2D");
  *(undefined8 *)(gl + 0x360) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCopyTexSubImage3D");
  *(undefined8 *)(gl + 0x368) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCreateProgram");
  *(undefined8 *)(gl + 0x3c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCreateShader");
  *(undefined8 *)(gl + 0x3f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glCullFace");
  *(undefined8 *)(gl + 0x418) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteBuffers");
  *(undefined8 *)(gl + 0x438) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteFramebuffers");
  *(undefined8 *)(gl + 0x440) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteProgram");
  *(undefined8 *)(gl + 0x448) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteQueries");
  *(undefined8 *)(gl + 0x458) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteRenderbuffers");
  *(undefined8 *)(gl + 0x460) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteShader");
  *(undefined8 *)(gl + 0x470) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteTextures");
  *(undefined8 *)(gl + 0x480) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDeleteVertexArrays");
  *(undefined8 *)(gl + 0x490) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDepthFunc");
  *(undefined8 *)(gl + 0x4a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDepthMask");
  *(undefined8 *)(gl + 0x4a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDepthRange");
  *(undefined8 *)(gl + 0x4b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDetachShader");
  *(undefined8 *)(gl + 0x4e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDisable");
  *(undefined8 *)(gl + 0x4e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDisableVertexAttribArray");
  *(undefined8 *)(gl + 0x518) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDisablei");
  *(undefined8 *)(gl + 0x520) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawArrays");
  *(undefined8 *)(gl + 0x538) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawArraysInstanced");
  *(undefined8 *)(gl + 0x548) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawBuffer");
  *(undefined8 *)(gl + 0x558) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawBuffers");
  *(undefined8 *)(gl + 0x560) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawElements");
  *(undefined8 *)(gl + 0x568) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawElementsInstanced");
  *(undefined8 *)(gl + 0x580) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glDrawRangeElements");
  *(undefined8 *)(gl + 0x5a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEnable");
  *(undefined8 *)(gl + 0x5e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEnableVertexAttribArray");
  *(undefined8 *)(gl + 0x610) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEnablei");
  *(undefined8 *)(gl + 0x618) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEndConditionalRender");
  *(undefined8 *)(gl + 0x620) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEndQuery");
  *(undefined8 *)(gl + 0x628) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glEndTransformFeedback");
  *(undefined8 *)(gl + 0x638) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFinish");
  *(undefined8 *)(gl + 0x648) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFlush");
  *(undefined8 *)(gl + 0x650) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFlushMappedBufferRange");
  *(undefined8 *)(gl + 0x658) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferRenderbuffer");
  *(undefined8 *)(gl + 0x688) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTexture1D");
  *(undefined8 *)(gl + 0x698) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTexture2D");
  *(undefined8 *)(gl + 0x6a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTexture3D");
  *(undefined8 *)(gl + 0x6a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFramebufferTextureLayer");
  *(undefined8 *)(gl + 0x6b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glFrontFace");
  *(undefined8 *)(gl + 0x6c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenBuffers");
  *(undefined8 *)(gl + 0x6c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenFramebuffers");
  *(undefined8 *)(gl + 0x6d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenQueries");
  *(undefined8 *)(gl + 0x6e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenRenderbuffers");
  *(undefined8 *)(gl + 0x6e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenTextures");
  *(undefined8 *)(gl + 0x6f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenVertexArrays");
  *(undefined8 *)(gl + 0x708) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGenerateMipmap");
  *(undefined8 *)(gl + 0x710) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveAttrib");
  *(undefined8 *)(gl + 0x730) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniform");
  *(undefined8 *)(gl + 0x750) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformBlockName");
  *(undefined8 *)(gl + 0x758) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformBlockiv");
  *(undefined8 *)(gl + 0x760) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformName");
  *(undefined8 *)(gl + 0x768) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetActiveUniformsiv");
  *(undefined8 *)(gl + 0x770) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetAttachedShaders");
  *(undefined8 *)(gl + 0x778) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetAttribLocation");
  *(undefined8 *)(gl + 0x780) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBooleani_v");
  *(undefined8 *)(gl + 0x790) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBooleanv");
  *(undefined8 *)(gl + 0x798) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferParameteriv");
  *(undefined8 *)(gl + 0x7a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferPointerv");
  *(undefined8 *)(gl + 0x7b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetBufferSubData");
  *(undefined8 *)(gl + 0x7b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetCompressedTexImage");
  *(undefined8 *)(gl + 0x7c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetDoublev");
  *(undefined8 *)(gl + 0x7f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetError");
  *(undefined8 *)(gl + 0x800) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetFloatv");
  *(undefined8 *)(gl + 0x818) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetFragDataLocation");
  *(undefined8 *)(gl + 0x828) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetFramebufferAttachmentParameteriv");
  *(undefined8 *)(gl + 0x830) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetIntegeri_v");
  *(undefined8 *)(gl + 0x860) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetIntegerv");
  *(undefined8 *)(gl + 0x868) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetProgramInfoLog");
  *(undefined8 *)(gl + 0x988) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetProgramiv");
  *(undefined8 *)(gl + 0x9d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetQueryObjectiv");
  *(undefined8 *)(gl + 0xa10) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetQueryObjectuiv");
  *(undefined8 *)(gl + 0xa20) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetQueryiv");
  *(undefined8 *)(gl + 0xa28) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetRenderbufferParameteriv");
  *(undefined8 *)(gl + 0xa30) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderInfoLog");
  *(undefined8 *)(gl + 0xa58) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderSource");
  *(undefined8 *)(gl + 0xa68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetShaderiv");
  *(undefined8 *)(gl + 0xa70) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetString");
  *(undefined8 *)(gl + 0xa78) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetStringi");
  *(undefined8 *)(gl + 0xa80) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexImage");
  *(undefined8 *)(gl + 0xaa0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexLevelParameterfv");
  *(undefined8 *)(gl + 0xaa8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexLevelParameteriv");
  *(undefined8 *)(gl + 0xab0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameterIiv");
  *(undefined8 *)(gl + 0xab8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameterIuiv");
  *(undefined8 *)(gl + 0xac0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameterfv");
  *(undefined8 *)(gl + 0xac8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTexParameteriv");
  *(undefined8 *)(gl + 0xad0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetTransformFeedbackVarying");
  *(undefined8 *)(gl + 0xb18) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformBlockIndex");
  *(undefined8 *)(gl + 0xb38) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformIndices");
  *(undefined8 *)(gl + 0xb40) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformLocation");
  *(undefined8 *)(gl + 0xb48) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformfv");
  *(undefined8 *)(gl + 0xb60) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformiv");
  *(undefined8 *)(gl + 0xb68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetUniformuiv");
  *(undefined8 *)(gl + 0xb70) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribIiv");
  *(undefined8 *)(gl + 0xbb0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribIuiv");
  *(undefined8 *)(gl + 3000) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribPointerv");
  *(undefined8 *)(gl + 0xbc8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribdv");
  *(undefined8 *)(gl + 0xbd0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribfv");
  *(undefined8 *)(gl + 0xbd8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glGetVertexAttribiv");
  *(undefined8 *)(gl + 0xbe0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glHint");
  *(undefined8 *)(gl + 0xc18) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsBuffer");
  *(undefined8 *)(gl + 0xc68) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsEnabled");
  *(undefined8 *)(gl + 0xc70) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsEnabledi");
  *(undefined8 *)(gl + 0xc80) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsFramebuffer");
  *(undefined8 *)(gl + 0xc88) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsProgram");
  *(undefined8 *)(gl + 0xc90) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsQuery");
  *(undefined8 *)(gl + 0xca0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsRenderbuffer");
  *(undefined8 *)(gl + 0xca8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsShader");
  *(undefined8 *)(gl + 0xcb8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsTexture");
  *(undefined8 *)(gl + 0xcc8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glIsVertexArray");
  *(undefined8 *)(gl + 0xcd8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glLineWidth");
  *(undefined8 *)(gl + 0xce0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glLinkProgram");
  *(undefined8 *)(gl + 0xce8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glLogicOp");
  *(undefined8 *)(gl + 0xcf0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glMapBuffer");
  *(undefined8 *)(gl + 0xcf8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glMapBufferRange");
  *(undefined8 *)(gl + 0xd00) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glMultiDrawArrays");
  *(undefined8 *)(gl + 0xdd0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glMultiDrawElements");
  *(undefined8 *)(gl + 0xde0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPixelStoref");
  *(undefined8 *)(gl + 0xfe8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPixelStorei");
  *(undefined8 *)(gl + 0xff0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPointParameterf");
  *(undefined8 *)(gl + 0xff8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPointParameterfv");
  *(undefined8 *)(gl + 0x1000) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPointParameteri");
  *(undefined8 *)(gl + 0x1008) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPointParameteriv");
  *(undefined8 *)(gl + 0x1010) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPointSize");
  *(undefined8 *)(gl + 0x1018) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPolygonMode");
  *(undefined8 *)(gl + 0x1020) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPolygonOffset");
  *(undefined8 *)(gl + 0x1028) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glPrimitiveRestartIndex");
  *(undefined8 *)(gl + 0x1048) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glReadBuffer");
  *(undefined8 *)(gl + 0x1218) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glReadPixels");
  *(undefined8 *)(gl + 0x1220) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glRenderbufferStorage");
  *(undefined8 *)(gl + 0x1238) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glRenderbufferStorageMultisample");
  *(undefined8 *)(gl + 0x1240) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glSampleCoverage");
  *(undefined8 *)(gl + 0x1250) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glScissor");
  *(undefined8 *)(gl + 0x1290) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glShaderSource");
  *(undefined8 *)(gl + 0x12b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilFunc");
  *(undefined8 *)(gl + 0x12c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilFuncSeparate");
  *(undefined8 *)(gl + 0x12d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilMask");
  *(undefined8 *)(gl + 0x12d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilMaskSeparate");
  *(undefined8 *)(gl + 0x12e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilOp");
  *(undefined8 *)(gl + 0x12e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glStencilOpSeparate");
  *(undefined8 *)(gl + 0x12f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexBuffer");
  *(undefined8 *)(gl + 0x12f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexImage1D");
  *(undefined8 *)(gl + 0x1308) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexImage2D");
  *(undefined8 *)(gl + 0x1310) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexImage3D");
  *(undefined8 *)(gl + 0x1320) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterIiv");
  *(undefined8 *)(gl + 0x1340) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterIuiv");
  *(undefined8 *)(gl + 0x1348) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterf");
  *(undefined8 *)(gl + 0x1350) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameterfv");
  *(undefined8 *)(gl + 0x1358) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameteri");
  *(undefined8 *)(gl + 0x1360) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexParameteriv");
  *(undefined8 *)(gl + 0x1368) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexSubImage1D");
  *(undefined8 *)(gl + 0x13b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexSubImage2D");
  *(undefined8 *)(gl + 0x13b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTexSubImage3D");
  *(undefined8 *)(gl + 0x13c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glTransformFeedbackVaryings");
  *(undefined8 *)(gl + 0x14c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1f");
  *(undefined8 *)(gl + 0x14e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1fv");
  *(undefined8 *)(gl + 0x14e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1i");
  *(undefined8 *)(gl + 0x14f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1iv");
  *(undefined8 *)(gl + 0x14f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1ui");
  *(undefined8 *)(gl + 0x1500) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform1uiv");
  *(undefined8 *)(gl + 0x1508) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2f");
  *(undefined8 *)(gl + 0x1520) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2fv");
  *(undefined8 *)(gl + 0x1528) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2i");
  *(undefined8 *)(gl + 0x1530) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2iv");
  *(undefined8 *)(gl + 0x1538) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2ui");
  *(undefined8 *)(gl + 0x1540) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform2uiv");
  *(undefined8 *)(gl + 0x1548) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3f");
  *(undefined8 *)(gl + 0x1560) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3fv");
  *(undefined8 *)(gl + 0x1568) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3i");
  *(undefined8 *)(gl + 0x1570) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3iv");
  *(undefined8 *)(gl + 0x1578) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3ui");
  *(undefined8 *)(gl + 0x1580) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform3uiv");
  *(undefined8 *)(gl + 0x1588) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4f");
  *(undefined8 *)(gl + 0x15a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4fv");
  *(undefined8 *)(gl + 0x15a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4i");
  *(undefined8 *)(gl + 0x15b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4iv");
  *(undefined8 *)(gl + 0x15b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4ui");
  *(undefined8 *)(gl + 0x15c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniform4uiv");
  *(undefined8 *)(gl + 0x15c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformBlockBinding");
  *(undefined8 *)(gl + 0x15d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix2fv");
  *(undefined8 *)(gl + 0x15e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix2x3fv");
  *(undefined8 *)(gl + 0x15f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix2x4fv");
  *(undefined8 *)(gl + 0x1600) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix3fv");
  *(undefined8 *)(gl + 0x1610) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix3x2fv");
  *(undefined8 *)(gl + 0x1620) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix3x4fv");
  *(undefined8 *)(gl + 0x1630) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix4fv");
  *(undefined8 *)(gl + 0x1640) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix4x2fv");
  *(undefined8 *)(gl + 0x1650) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUniformMatrix4x3fv");
  *(undefined8 *)(gl + 0x1660) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUnmapBuffer");
  *(undefined8 *)(gl + 0x1670) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glUseProgram");
  *(undefined8 *)(gl + 0x1680) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glValidateProgram");
  *(undefined8 *)(gl + 0x1690) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1d");
  *(undefined8 *)(gl + 0x1778) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1dv");
  *(undefined8 *)(gl + 0x1780) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1f");
  *(undefined8 *)(gl + 0x1788) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1fv");
  *(undefined8 *)(gl + 0x1790) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1s");
  *(undefined8 *)(gl + 0x1798) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib1sv");
  *(undefined8 *)(gl + 0x17a0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2d");
  *(undefined8 *)(gl + 0x17a8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2dv");
  *(undefined8 *)(gl + 0x17b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2f");
  *(undefined8 *)(gl + 0x17b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2fv");
  *(undefined8 *)(gl + 0x17c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2s");
  *(undefined8 *)(gl + 0x17c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib2sv");
  *(undefined8 *)(gl + 0x17d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3d");
  *(undefined8 *)(gl + 0x17d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3dv");
  *(undefined8 *)(gl + 0x17e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3f");
  *(undefined8 *)(gl + 0x17e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3fv");
  *(undefined8 *)(gl + 0x17f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3s");
  *(undefined8 *)(gl + 0x17f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib3sv");
  *(undefined8 *)(gl + 0x1800) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Nbv");
  *(undefined8 *)(gl + 0x1808) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Niv");
  *(undefined8 *)(gl + 0x1810) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Nsv");
  *(undefined8 *)(gl + 0x1818) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Nub");
  *(undefined8 *)(gl + 0x1820) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Nubv");
  *(undefined8 *)(gl + 0x1828) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Nuiv");
  *(undefined8 *)(gl + 0x1830) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4Nusv");
  *(undefined8 *)(gl + 0x1838) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4bv");
  *(undefined8 *)(gl + 0x1840) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4d");
  *(undefined8 *)(gl + 0x1848) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4dv");
  *(undefined8 *)(gl + 0x1850) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4f");
  *(undefined8 *)(gl + 0x1858) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4fv");
  *(undefined8 *)(gl + 0x1860) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4iv");
  *(undefined8 *)(gl + 0x1868) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4s");
  *(undefined8 *)(gl + 0x1870) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4sv");
  *(undefined8 *)(gl + 0x1878) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4ubv");
  *(undefined8 *)(gl + 0x1880) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4uiv");
  *(undefined8 *)(gl + 0x1888) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttrib4usv");
  *(undefined8 *)(gl + 0x1890) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI1i");
  *(undefined8 *)(gl + 0x18b0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI1iv");
  *(undefined8 *)(gl + 0x18b8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI1ui");
  *(undefined8 *)(gl + 0x18c0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI1uiv");
  *(undefined8 *)(gl + 0x18c8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI2i");
  *(undefined8 *)(gl + 0x18d0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI2iv");
  *(undefined8 *)(gl + 0x18d8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI2ui");
  *(undefined8 *)(gl + 0x18e0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI2uiv");
  *(undefined8 *)(gl + 0x18e8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI3i");
  *(undefined8 *)(gl + 0x18f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI3iv");
  *(undefined8 *)(gl + 0x18f8) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI3ui");
  *(undefined8 *)(gl + 0x1900) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI3uiv");
  *(undefined8 *)(gl + 0x1908) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4bv");
  *(undefined8 *)(gl + 0x1910) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4i");
  *(undefined8 *)(gl + 0x1918) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4iv");
  *(undefined8 *)(gl + 0x1920) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4sv");
  *(undefined8 *)(gl + 0x1928) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4ubv");
  *(undefined8 *)(gl + 0x1930) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4ui");
  *(undefined8 *)(gl + 0x1938) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4uiv");
  *(undefined8 *)(gl + 0x1940) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribI4usv");
  *(undefined8 *)(gl + 0x1948) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribIPointer");
  *(undefined8 *)(gl + 0x1958) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glVertexAttribPointer");
  *(undefined8 *)(gl + 0x19f0) = uVar1;
  uVar1 = (*(code *)**(undefined8 **)loader)(loader,"glViewport");
  *(undefined8 *)(gl + 0x1a00) = uVar1;
  return;
}

Assistant:

void initGL31Core (Functions* gl, const FunctionLoader* loader)
{
#include "glwInitGL31.inl"
}